

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O2

bool crnlib::prefix_coding::generate_codes(uint num_syms,uint8 *pCodesizes,uint16 *pCodes)

{
  bool bVar1;
  uint i_1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int local_98 [6];
  uint num_codes [17];
  
  num_codes[6] = 0;
  num_codes[7] = 0;
  num_codes[8] = 0;
  num_codes[9] = 0;
  num_codes[2] = 0;
  num_codes[3] = 0;
  num_codes[4] = 0;
  num_codes[5] = 0;
  num_codes[10] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  num_codes[0] = 0;
  num_codes[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  for (uVar3 = 0; num_syms != uVar3; uVar3 = uVar3 + 1) {
    if ((ulong)pCodesizes[uVar3] != 0) {
      local_98[pCodesizes[uVar3]] = local_98[pCodesizes[uVar3]] + 1;
    }
  }
  uVar2 = 0;
  for (lVar5 = 1; lVar5 != 0x11; lVar5 = lVar5 + 1) {
    num_codes[lVar5 + 0xe] = uVar2;
    uVar2 = (uVar2 + local_98[lVar5]) * 2;
  }
  if (uVar2 == 0x20000) {
LAB_0018a177:
    for (uVar3 = 0; num_syms != uVar3; uVar3 = uVar3 + 1) {
      uVar6 = (ulong)pCodesizes[uVar3];
      if (uVar6 != 0) {
        uVar2 = num_codes[uVar6 + 0xe];
        num_codes[uVar6 + 0xe] = uVar2 + 1;
        pCodes[uVar3] = (uint16)uVar2;
      }
    }
    bVar1 = true;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (lVar5 == 0x10) goto LAB_0018a177;
      uVar4 = uVar4 + local_98[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (uVar4 < 2);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool generate_codes(uint num_syms, const uint8* pCodesizes, uint16* pCodes) {
  uint num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(c <= cMaxExpectedCodeSize);
      num_codes[c]++;
    }
  }

  uint code = 0;

  uint next_code[cMaxExpectedCodeSize + 1];
  next_code[0] = 0;

  for (uint i = 1; i <= cMaxExpectedCodeSize; i++) {
    next_code[i] = code;

    code = (code + num_codes[i]) << 1;
  }

  if (code != (1 << (cMaxExpectedCodeSize + 1))) {
    uint t = 0;
    for (uint i = 1; i <= cMaxExpectedCodeSize; i++) {
      t += num_codes[i];
      if (t > 1)
        return false;
    }
  }

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(next_code[c] <= cUINT16_MAX);
      pCodes[i] = static_cast<uint16>(next_code[c]++);

      CRNLIB_ASSERT(math::total_bits(pCodes[i]) <= pCodesizes[i]);
    }
  }

  return true;
}